

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O2

void __thiscall APITests::test_wait_for_edge_falling(APITests *this)

{
  Edge EVar1;
  int iVar2;
  bool b;
  int iVar3;
  void *__stat_loc;
  allocator local_81;
  future<void> dsc;
  WaitResult result;
  string local_50;
  string local_30;
  
  GPIO::setmode(BOARD);
  GPIO::setup((this->pin_data).out_a,OUT,1);
  GPIO::setup((this->pin_data).in_a,IN,-1);
  DelayedSetChannel((int)&dsc,(this->pin_data).out_a,0.5);
  EVar1 = (this->pin_data).in_a;
  __stat_loc = (void *)(ulong)EVar1;
  GPIO::wait_for_edge((int)&result,EVar1,3,10);
  std::__basic_future<void>::wait(&dsc.super___basic_future<void>,__stat_loc);
  iVar3 = std::__cxx11::stoi((string *)&result,(size_t *)0x0,10);
  iVar2 = (this->pin_data).in_a;
  std::__cxx11::string::string((string *)&local_30,"",&local_81);
  assert::is_true(iVar3 == iVar2,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  b = (bool)GPIO::WaitResult::is_event_detected();
  std::__cxx11::string::string((string *)&local_50,"",&local_81);
  assert::is_true(b,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  GPIO::cleanup();
  std::__cxx11::string::~string((string *)&result);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&dsc.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void test_wait_for_edge_falling()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.out_a, GPIO::OUT, GPIO::HIGH);
        GPIO::setup(pin_data.in_a, GPIO::IN);
        auto dsc = DelayedSetChannel(pin_data.out_a, GPIO::LOW, 0.5);
        auto result = GPIO::wait_for_edge(pin_data.in_a, GPIO::FALLING, 10, 1000);
        dsc.wait();
        assert::is_true(std::stoi(result.channel()) == pin_data.in_a);
        assert::is_true(result.is_event_detected());
        GPIO::cleanup();
    }